

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTim.c
# Opt level: O1

int Gia_ManLevelWithBoxes(Gia_Man_t *p)

{
  Tim_Man_t *p_00;
  Vec_Int_t *pVVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  float *pfVar9;
  int Fill;
  int Fill_00;
  int Fill_01;
  int *piVar10;
  Gia_Obj_t *pGVar11;
  float *pfVar12;
  float *pfVar13;
  int iVar14;
  ulong uVar15;
  Gia_Obj_t *pGVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  bool bVar20;
  bool bVar21;
  float fVar22;
  int local_ac;
  int local_a0;
  int local_74;
  
  iVar3 = p->nAnd2Delay + (uint)(p->nAnd2Delay == 0);
  if (p->nRegs != 0) {
    __assert_fail("Gia_ManRegNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaTim.c"
                  ,0x1e4,"int Gia_ManLevelWithBoxes(Gia_Man_t *)");
  }
  if (p->nBufs != 0) {
    __assert_fail("Gia_ManBufNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaTim.c"
                  ,0x1e5,"int Gia_ManLevelWithBoxes(Gia_Man_t *)");
  }
  p_00 = (Tim_Man_t *)p->pManTime;
  Gia_ManCleanLevels(p,p->nObjs);
  if (0 < p->nObjs) {
    pVVar1 = p->vLevels;
    Vec_IntFillExtra(pVVar1,1,Fill);
    if (pVVar1->nSize < 1) {
LAB_0023561f:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    *pVVar1->pArray = 0;
    Gia_ManIncrementTravId(p);
    if (0 < p->nObjs) {
      if (p->nTravIdsAlloc < 1) {
LAB_0023563e:
        __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x262,"void Gia_ObjSetTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
      }
      *p->pTravIds = p->nTravIds;
      iVar4 = Tim_ManPiNum(p_00);
      if (0 < iVar4) {
        lVar18 = 0;
        do {
          if (p->vCis->nSize <= lVar18) goto LAB_002355c2;
          iVar4 = p->vCis->pArray[lVar18];
          if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) goto LAB_002355e1;
          pGVar11 = p->pObjs + iVar4;
          fVar22 = Tim_ManGetCiArrival(p_00,(int)lVar18);
          pGVar16 = p->pObjs;
          if ((pGVar11 < pGVar16) || (pGVar16 + p->nObjs <= pGVar11)) goto LAB_00235600;
          uVar5 = (int)((long)pGVar11 - (long)pGVar16 >> 2) * -0x55555555;
          pVVar1 = p->vLevels;
          Vec_IntFillExtra(pVVar1,uVar5 + 1,Fill_00);
          if (((int)uVar5 < 0) || (pVVar1->nSize <= (int)uVar5)) goto LAB_0023561f;
          pVVar1->pArray[uVar5 & 0x7fffffff] = (int)(fVar22 / (float)iVar3);
          pGVar16 = p->pObjs;
          if ((pGVar11 < pGVar16) || (pGVar16 + p->nObjs <= pGVar11)) goto LAB_00235600;
          iVar4 = (int)((long)pGVar11 - (long)pGVar16 >> 2) * -0x55555555;
          if (p->nTravIdsAlloc <= iVar4) goto LAB_0023563e;
          p->pTravIds[iVar4] = p->nTravIds;
          lVar18 = lVar18 + 1;
          iVar4 = Tim_ManPiNum(p_00);
        } while (lVar18 < iVar4);
      }
      local_a0 = Tim_ManPiNum(p_00);
      iVar4 = Tim_ManBoxNum(p_00);
      if (iVar4 < 1) {
        local_ac = 0;
      }
      else {
        iVar4 = 0;
        local_ac = 0;
        do {
          uVar5 = Tim_ManBoxInputNum(p_00,iVar4);
          uVar6 = Tim_ManBoxOutputNum(p_00,iVar4);
          pfVar9 = Tim_ManBoxDelayTable(p_00,iVar4);
          uVar19 = (ulong)uVar5;
          bVar20 = 0 < (int)uVar5;
          if (0 < (int)uVar5) {
            lVar18 = (long)local_ac;
            uVar15 = 1;
            do {
              if ((local_ac < 0) || (p->vCos->nSize <= lVar18)) goto LAB_002355c2;
              iVar7 = p->vCos->pArray[lVar18];
              if (((long)iVar7 < 0) || (p->nObjs <= iVar7)) goto LAB_002355e1;
              pGVar16 = p->pObjs + iVar7;
              iVar7 = Gia_ManLevelWithBoxes_rec
                                (p,pGVar16 + -(ulong)((uint)*(undefined8 *)pGVar16 & 0x1fffffff));
              if (iVar7 != 0) {
                puts(
                    "Boxes are not in a topological order. Switching to level computation without boxes."
                    );
                local_74 = Gia_ManLevelNum(p);
                goto LAB_0023540e;
              }
              Gia_ObjSetCoLevel(p,pGVar16);
              bVar20 = uVar15 < uVar19;
              lVar18 = lVar18 + 1;
              bVar21 = uVar15 != uVar19;
              uVar15 = uVar15 + 1;
            } while (bVar21);
          }
          if (0 < (int)uVar6) {
            pfVar12 = pfVar9 + 3;
            uVar15 = 0;
            do {
              if (local_a0 < 0) goto LAB_002355c2;
              if ((long)p->vCis->nSize <= (long)((long)local_a0 + uVar15)) goto LAB_002355c2;
              iVar7 = p->vCis->pArray[(long)local_a0 + uVar15];
              lVar18 = (long)iVar7;
              if ((lVar18 < 0) || (p->nObjs <= iVar7)) goto LAB_002355e1;
              if (p->nTravIdsAlloc <= iVar7) goto LAB_0023563e;
              pGVar16 = p->pObjs + lVar18;
              piVar10 = p->pTravIds;
              piVar10[lVar18] = p->nTravIds;
              if (uVar5 != (int)pfVar9[1]) {
                __assert_fail("nBoxInputs == (int)pDelayTable[1]",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaTim.c"
                              ,0x20c,"int Gia_ManLevelWithBoxes(Gia_Man_t *)");
              }
              if ((int)uVar5 < 1) {
                iVar7 = 0;
              }
              else {
                iVar7 = 0;
                pfVar13 = pfVar12;
                lVar18 = (long)local_ac;
                uVar17 = uVar19;
                iVar14 = iVar7;
                do {
                  if ((local_ac < 0) || (p->vCos->nSize <= lVar18)) goto LAB_002355c2;
                  iVar8 = p->vCos->pArray[lVar18];
                  if (((long)iVar8 < 0) || (p->nObjs <= iVar8)) goto LAB_002355e1;
                  if (p->pObjs == (Gia_Obj_t *)0x0) break;
                  if ((int)*pfVar13 != -1000000000) {
                    if (p->nObjs <= iVar8) goto LAB_00235600;
                    pVVar1 = p->vLevels;
                    Vec_IntFillExtra(pVVar1,iVar8 + 1,(int)piVar10);
                    if (pVVar1->nSize <= iVar8) goto LAB_002355c2;
                    piVar10 = (int *)((long)(int)*pfVar13 % (long)iVar3 & 0xffffffff);
                    iVar8 = (int)*pfVar13 / iVar3 + pVVar1->pArray[iVar8];
                    bVar21 = iVar7 <= iVar8;
                    iVar7 = iVar14;
                    if (bVar21) {
                      iVar7 = iVar8;
                      iVar14 = iVar8;
                    }
                  }
                  pfVar13 = pfVar13 + 1;
                  lVar18 = lVar18 + 1;
                  uVar17 = uVar17 - 1;
                } while (uVar17 != 0);
              }
              pGVar11 = p->pObjs;
              if ((pGVar16 < pGVar11) || (pGVar11 + p->nObjs <= pGVar16)) goto LAB_00235600;
              uVar2 = (int)((long)pGVar16 - (long)pGVar11 >> 2) * -0x55555555;
              pVVar1 = p->vLevels;
              Vec_IntFillExtra(pVVar1,uVar2 + 1,(int)piVar10);
              if (((int)uVar2 < 0) || (pVVar1->nSize <= (int)uVar2)) goto LAB_0023561f;
              pVVar1->pArray[uVar2 & 0x7fffffff] = iVar7;
              uVar15 = uVar15 + 1;
              pfVar12 = pfVar12 + uVar19;
            } while (uVar15 != uVar6);
          }
          local_ac = local_ac + uVar5;
          local_a0 = local_a0 + uVar6;
LAB_0023540e:
          if (bVar20) {
            return local_74;
          }
          iVar4 = iVar4 + 1;
          iVar7 = Tim_ManBoxNum(p_00);
        } while (iVar4 < iVar7);
      }
      p->nLevels = 0;
      iVar3 = Tim_ManCoNum(p_00);
      iVar4 = Tim_ManPoNum(p_00);
      uVar5 = iVar3 - iVar4;
      iVar3 = Tim_ManCoNum(p_00);
      if ((int)uVar5 < iVar3) {
        uVar19 = (ulong)uVar5;
LAB_00235482:
        if (((int)uVar5 < 0) || (p->vCos->nSize <= (int)uVar19)) {
LAB_002355c2:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar3 = p->vCos->pArray[uVar19];
        if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) {
LAB_002355e1:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        pGVar16 = p->pObjs + iVar3;
        Gia_ManLevelWithBoxes_rec(p,pGVar16 + -(ulong)((uint)*(undefined8 *)pGVar16 & 0x1fffffff));
        Gia_ObjSetCoLevel(p,pGVar16);
        pGVar11 = p->pObjs;
        if ((pGVar16 < pGVar11) || (pGVar11 + p->nObjs <= pGVar16)) goto LAB_00235600;
        iVar3 = p->nLevels;
        uVar6 = (int)((long)pGVar16 - (long)pGVar11 >> 2) * -0x55555555;
        pVVar1 = p->vLevels;
        Vec_IntFillExtra(pVVar1,uVar6 + 1,Fill_01);
        if (((int)uVar6 < 0) || (pVVar1->nSize <= (int)uVar6)) goto LAB_002355c2;
        iVar4 = pVVar1->pArray[uVar6 & 0x7fffffff];
        if (pVVar1->pArray[uVar6 & 0x7fffffff] < iVar3) {
          iVar4 = iVar3;
        }
        p->nLevels = iVar4;
        uVar19 = uVar19 + 1;
        iVar3 = Tim_ManCoNum(p_00);
        if ((int)uVar19 < iVar3) goto LAB_00235482;
      }
      iVar3 = Tim_ManPoNum(p_00);
      if (local_a0 != p->vCis->nSize) {
        __assert_fail("curCi == Gia_ManCiNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaTim.c"
                      ,0x221,"int Gia_ManLevelWithBoxes(Gia_Man_t *)");
      }
      if (iVar3 + local_ac == p->vCos->nSize) {
        return p->nLevels;
      }
      __assert_fail("curCo == Gia_ManCoNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaTim.c"
                    ,0x222,"int Gia_ManLevelWithBoxes(Gia_Man_t *)");
    }
  }
LAB_00235600:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

int Gia_ManLevelWithBoxes( Gia_Man_t * p )
{
    int nAnd2Delay = p->nAnd2Delay ? p->nAnd2Delay : 1;
    Tim_Man_t * pManTime = (Tim_Man_t *)p->pManTime;
    Gia_Obj_t * pObj, * pObjIn;
    int i, k, j, curCi, curCo, LevelMax;
    assert( Gia_ManRegNum(p) == 0 );
    assert( Gia_ManBufNum(p) == 0 );
    // copy const and real PIs
    Gia_ManCleanLevels( p, Gia_ManObjNum(p) );
    Gia_ObjSetLevel( p, Gia_ManConst0(p), 0 );
    Gia_ManIncrementTravId( p );
    Gia_ObjSetTravIdCurrent( p, Gia_ManConst0(p) );
    for ( i = 0; i < Tim_ManPiNum(pManTime); i++ )
    {
        pObj = Gia_ManCi( p, i );
        Gia_ObjSetLevel( p, pObj, Tim_ManGetCiArrival(pManTime, i) / nAnd2Delay );
        Gia_ObjSetTravIdCurrent( p, pObj );
    }
    // create logic for each box
    curCi = Tim_ManPiNum(pManTime);
    curCo = 0;
    for ( i = 0; i < Tim_ManBoxNum(pManTime); i++ )
    {
        int nBoxInputs  = Tim_ManBoxInputNum( pManTime, i );
        int nBoxOutputs = Tim_ManBoxOutputNum( pManTime, i );
        float * pDelayTable = Tim_ManBoxDelayTable( pManTime, i );
        // compute level for TFI of box inputs
        for ( k = 0; k < nBoxInputs; k++ )
        {
            pObj = Gia_ManCo( p, curCo + k );
            if ( Gia_ManLevelWithBoxes_rec( p, Gia_ObjFanin0(pObj) ) )
            {
                printf( "Boxes are not in a topological order. Switching to level computation without boxes.\n" );
                return Gia_ManLevelNum( p );
            }
            // set box input level
            Gia_ObjSetCoLevel( p, pObj );
        }
        // compute level for box outputs
        for ( k = 0; k < nBoxOutputs; k++ )
        {
            pObj = Gia_ManCi( p, curCi + k );
            Gia_ObjSetTravIdCurrent( p, pObj );
            // evaluate delay of this output
            LevelMax = 0;
            assert( nBoxInputs == (int)pDelayTable[1] );
            for ( j = 0; j < nBoxInputs && (pObjIn = Gia_ManCo(p, curCo + j)); j++ )
                if ( (int)pDelayTable[3+k*nBoxInputs+j] != -ABC_INFINITY )
                    LevelMax = Abc_MaxInt( LevelMax, Gia_ObjLevel(p, pObjIn) + ((int)pDelayTable[3+k*nBoxInputs+j] / nAnd2Delay) );
            // set box output level
            Gia_ObjSetLevel( p, pObj, LevelMax );
        }
        curCo += nBoxInputs;
        curCi += nBoxOutputs;
    }
    // add remaining nodes
    p->nLevels = 0;
    for ( i = Tim_ManCoNum(pManTime) - Tim_ManPoNum(pManTime); i < Tim_ManCoNum(pManTime); i++ )
    {
        pObj = Gia_ManCo( p, i );
        Gia_ManLevelWithBoxes_rec( p, Gia_ObjFanin0(pObj) );
        Gia_ObjSetCoLevel( p, pObj );
        p->nLevels = Abc_MaxInt( p->nLevels, Gia_ObjLevel(p, pObj) );
    }
    curCo += Tim_ManPoNum(pManTime);
    // verify counts
    assert( curCi == Gia_ManCiNum(p) );
    assert( curCo == Gia_ManCoNum(p) );
//    printf( "Max level is %d.\n", p->nLevels );
    return p->nLevels;
}